

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::NavMoveRequestResolveWithLastItem(void)

{
  ImGuiContext_conflict1 *pIVar1;
  
  pIVar1 = GImGui;
  GImGui->NavMoveScoringItems = false;
  NavApplyItemToResult(&pIVar1->NavMoveResultLocal);
  NavUpdateAnyRequestFlag();
  return;
}

Assistant:

void ImGui::NavMoveRequestResolveWithLastItem()
{
    ImGuiContext& g = *GImGui;
    g.NavMoveScoringItems = false; // Ensure request doesn't need more processing
    NavApplyItemToResult(&g.NavMoveResultLocal);
    NavUpdateAnyRequestFlag();
}